

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::SourceCodeInfo::MergePartialFromCodedStream
          (SourceCodeInfo *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  void *pvVar4;
  bool bVar5;
  uint32 uVar6;
  int byte_limit;
  Type *this_00;
  pair<int,_int> pVar7;
  UnknownFieldSet *unknown_fields;
  uint tag;
  ulong uVar8;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003c2aa3;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003c2aa3:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    tag = (uint)uVar8;
    if (((uVar8 & 0x100000000) == 0) || ((char)uVar8 != '\n' || (tag & 0xfffffff8) != 8)) {
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    }
    else {
      this_00 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                          (&(this->location_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar7 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar5 = SourceCodeInfo_Location::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar7.first);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SourceCodeInfo::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.SourceCodeInfo)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_location()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.SourceCodeInfo)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.SourceCodeInfo)
  return false;
#undef DO_
}